

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O2

void anon_unknown.dwarf_b7c4f::Json::check_error(string *src,error_code err)

{
  parser<json_out_callbacks> *this;
  char *pcVar1;
  unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  *message;
  AssertHelper AStack_138;
  AssertionResult gtest_ar_1;
  error_code local_120;
  string res;
  error_code err_local;
  json_out_callbacks local_e8;
  parser<json_out_callbacks> p;
  
  res._M_dataplus._M_p._0_4_ = 0;
  err_local = err;
  testing::internal::CmpHelperNE<pstore::json::error_code,pstore::json::error_code>
            ((internal *)&p,"err","json::error_code::none",&err_local,(error_code *)&res);
  if ((char)p.singletons_._M_t.
            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
            .
            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&res);
    if (p.stack_.c.
        super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
      message = (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                 *)0x173869;
    }
    else {
      message = *p.stack_.c.
                 super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x20,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&res);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((long *)CONCAT44(res._M_dataplus._M_p._4_4_,res._M_dataplus._M_p._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(res._M_dataplus._M_p._4_4_,res._M_dataplus._M_p._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&p.stack_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&p.stack_);
    local_e8.out_._M_dataplus._M_p = (pointer)&local_e8.out_.field_2;
    local_e8.out_.field_2._M_allocated_capacity = 0;
    local_e8.out_.field_2._8_8_ = 0;
    local_e8.out_._M_string_length = 0;
    pstore::json::parser<json_out_callbacks>::parser(&p,&local_e8,none);
    std::__cxx11::string::~string((string *)&local_e8);
    this = pstore::json::parser<json_out_callbacks>::input(&p,src);
    pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&res,this);
    pcVar1 = "";
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
              ((internal *)&gtest_ar_1,"res","\"\"",&res,(char (*) [1])0x173869);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_120);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                 ,0x23,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&AStack_138);
      if ((long *)CONCAT44(local_120._4_4_,local_120._M_value) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_120._4_4_,local_120._M_value) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_120._M_cat = pstore::json::get_error_category();
    local_120._M_value = 0;
    testing::internal::CmpHelperNE<std::error_code,std::error_code>
              ((internal *)&gtest_ar_1,"p.last_error ()","make_error_code (json::error_code::none)",
               &p.error_,&local_120);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_120);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                 ,0x24,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&AStack_138);
      if ((long *)CONCAT44(local_120._4_4_,local_120._M_value) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_120._4_4_,local_120._M_value) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    std::__cxx11::string::~string((string *)&res);
    pstore::json::parser<json_out_callbacks>::~parser(&p);
  }
  return;
}

Assistant:

static void check_error (std::string const & src, json::error_code err) {
            ASSERT_NE (err, json::error_code::none);
            json::parser<json_out_callbacks> p;
            std::string const res = p.input (src).eof ();
            EXPECT_EQ (res, "");
            EXPECT_NE (p.last_error (), make_error_code (json::error_code::none));
        }